

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O2

int32_t uprv_uint32Comparator_63(void *context,void *left,void *right)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*right <= *left) {
    uVar1 = (uint)(*left != *right);
  }
  return uVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_uint32Comparator(const void *context, const void *left, const void *right) {
    (void)context;
    uint32_t l=*(const uint32_t *)left, r=*(const uint32_t *)right;

    /* compare directly because (l-r) would overflow the int32_t result */
    if(l<r) {
        return -1;
    } else if(l==r) {
        return 0;
    } else /* l>r */ {
        return 1;
    }
}